

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void std::
     __insertion_sort<QList<QGraphicsObject*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
               (iterator __first,iterator __last,
               _Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)> __comp)

{
  long lVar1;
  QGraphicsObject *pQVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  QGraphicsItem *pQVar6;
  QGraphicsItem *pQVar7;
  iterator __last_00;
  iterator iVar8;
  
  if (__first.i != __last.i) {
    iVar8.i = __first.i;
    for (__last_00.i = __first.i + 1; __last_00.i != __last.i; __last_00.i = __last_00.i + 1) {
      pQVar7 = &(*__last_00.i)->super_QGraphicsItem;
      if (*__last_00.i == (QGraphicsObject *)0x0) {
        pQVar7 = (QGraphicsItem *)0x0;
      }
      pQVar6 = &(*__first.i)->super_QGraphicsItem;
      if (*__first.i == (QGraphicsObject *)0x0) {
        pQVar6 = (QGraphicsItem *)0x0;
      }
      bVar3 = (*__comp._M_comp)(pQVar7,pQVar6);
      if (bVar3) {
        pQVar2 = *__last_00.i;
        lVar4 = (long)__last_00.i - (long)__first.i >> 3;
        if (0 < lVar4) {
          lVar5 = 1;
          do {
            iVar8.i[lVar5] = iVar8.i[lVar5 + -1];
            lVar1 = lVar4 + lVar5;
            lVar5 = lVar5 + -1;
          } while (1 < lVar1 - 1U);
        }
        *__first.i = pQVar2;
      }
      else {
        __unguarded_linear_insert<QList<QGraphicsObject*>::iterator,__gnu_cxx::__ops::_Val_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                  (__last_00,
                   (_Val_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)
                   __comp._M_comp);
      }
      iVar8.i = iVar8.i + 1;
    }
  }
  return;
}

Assistant:

inline constexpr bool operator!=(iterator o) const { return i != o.i; }